

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables_ext.c
# Opt level: O1

int parse_port(char *str,uint16_t *ports)

{
  uint32_t max;
  uint32_t min;
  
  __isoc99_sscanf((char)str,"%u:%u");
  return -1;
}

Assistant:

static int parse_port(const char *str, uint16_t *ports)
{
	uint32_t min = 0, max = 0;

	if (sscanf(str, "%u:%u", &min, &max) > 0) {
		if (0 < min && max <= 0xFFFF) {

			if (max > 0 && min > max) {
				return -1;
			}

			ports[0] = (uint16_t)min;
			ports[1] = (uint16_t)max;
		} else {
			return -1;
		}
	} else {
		return -1;
	}

	return 0;
}